

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cpp_db::value_of<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cpp_db *this,value *val)

{
  int iVar1;
  type_info *ptVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  type_mismatch *this_00;
  type_index local_28;
  type_index local_20;
  
  ptVar2 = std::any::type((any *)this);
  iVar1 = strcmp(*(char **)(ptVar2 + 8) + (**(char **)(ptVar2 + 8) == '*'),"St6vectorIhSaIhEE");
  if (iVar1 != 0) {
    this_00 = (type_mismatch *)__cxa_allocate_exception(0x10);
    local_20 = type_of((value *)this);
    local_28._M_target =
         (type_info *)&std::vector<unsigned_char,std::allocator<unsigned_char>>::typeinfo;
    type_mismatch::type_mismatch(this_00,&local_20,&local_28);
    __cxa_throw(this_00,&type_mismatch::typeinfo,std::runtime_error::~runtime_error);
  }
  __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
        std::__any_caster<std::vector<unsigned_char,std::allocator<unsigned_char>>>((any *)this);
  if (__x != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

T value_of(const value &val)
    {
		if (!strcmp(val.type().name(), typeid(T).name()))
            return std::any_cast<T>(val);
        throw type_mismatch(type_of(val), typeid(T));
    }